

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlLoadShaderCode(char *vsCode,char *fsCode)

{
  GLenum local_13c;
  GLchar local_138 [4];
  GLenum type;
  char name [256];
  GLsizei local_30;
  int num;
  int namelen;
  int i;
  int uniformCount;
  uint fragmentShaderId;
  uint vertexShaderId;
  uint id;
  char *fsCode_local;
  char *vsCode_local;
  
  fragmentShaderId = 0;
  uniformCount = RLGL.State.defaultVShaderId;
  i = RLGL.State.defaultFShaderId;
  _vertexShaderId = fsCode;
  fsCode_local = vsCode;
  if (vsCode != (char *)0x0) {
    uniformCount = rlCompileShader(vsCode,0x8b31);
  }
  if (_vertexShaderId != (char *)0x0) {
    i = rlCompileShader(_vertexShaderId,0x8b30);
  }
  if ((uniformCount == RLGL.State.defaultVShaderId) && (i == RLGL.State.defaultFShaderId)) {
    fragmentShaderId = RLGL.State.defaultShader.id;
  }
  else {
    fragmentShaderId = rlLoadShaderProgram(uniformCount,i);
    if (uniformCount != RLGL.State.defaultVShaderId) {
      (*glad_glDetachShader)(fragmentShaderId,uniformCount);
      (*glad_glDeleteShader)(uniformCount);
    }
    if (i != RLGL.State.defaultFShaderId) {
      (*glad_glDetachShader)(fragmentShaderId,i);
      (*glad_glDeleteShader)(i);
    }
    if (fragmentShaderId == 0) {
      TraceLog(4,"SHADER: Failed to load custom shader code");
      fragmentShaderId = RLGL.State.defaultShader.id;
    }
  }
  namelen = -1;
  (*glad_glGetProgramiv)(fragmentShaderId,0x8b86,&namelen);
  for (num = 0; num < namelen; num = num + 1) {
    local_30 = -1;
    name[0xfc] = -1;
    name[0xfd] = -1;
    name[0xfe] = -1;
    name[0xff] = -1;
    local_13c = 0;
    (*glad_glGetActiveUniform)
              (fragmentShaderId,num,0xff,&local_30,(GLint *)(name + 0xfc),&local_13c,local_138);
    local_138[local_30] = '\0';
  }
  return fragmentShaderId;
}

Assistant:

unsigned int rlLoadShaderCode(const char *vsCode, const char *fsCode)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    unsigned int vertexShaderId = RLGL.State.defaultVShaderId;
    unsigned int fragmentShaderId = RLGL.State.defaultFShaderId;

    if (vsCode != NULL) vertexShaderId = rlCompileShader(vsCode, GL_VERTEX_SHADER);
    if (fsCode != NULL) fragmentShaderId = rlCompileShader(fsCode, GL_FRAGMENT_SHADER);

    if ((vertexShaderId == RLGL.State.defaultVShaderId) && (fragmentShaderId == RLGL.State.defaultFShaderId)) id = RLGL.State.defaultShader.id;
    else
    {
        id = rlLoadShaderProgram(vertexShaderId, fragmentShaderId);

        if (vertexShaderId != RLGL.State.defaultVShaderId)
        {
            // Detach shader before deletion to make sure memory is freed
            glDetachShader(id, vertexShaderId);
            glDeleteShader(vertexShaderId);
        }
        if (fragmentShaderId != RLGL.State.defaultFShaderId)
        {
            // Detach shader before deletion to make sure memory is freed
            glDetachShader(id, fragmentShaderId);
            glDeleteShader(fragmentShaderId);
        }

        if (id == 0)
        {
            TRACELOG(LOG_WARNING, "SHADER: Failed to load custom shader code");
            id = RLGL.State.defaultShader.id;
        }
    }

    // Get available shader uniforms
    // NOTE: This information is useful for debug...
    int uniformCount = -1;

    glGetProgramiv(id, GL_ACTIVE_UNIFORMS, &uniformCount);

    for (int i = 0; i < uniformCount; i++)
    {
        int namelen = -1;
        int num = -1;
        char name[256]; // Assume no variable names longer than 256
        GLenum type = GL_ZERO;

        // Get the name of the uniforms
        glGetActiveUniform(id, i, sizeof(name) - 1, &namelen, &num, &type, name);

        name[namelen] = 0;

        TRACELOGD("SHADER: [ID %i] Active uniform (%s) set at location: %i", id, name, glGetUniformLocation(id, name));
    }
#endif

    return id;
}